

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  uint num_rects;
  ImFontAtlasCustomRect *pIVar1;
  stbrp_rect *rects;
  int *piVar2;
  unsigned_short *puVar3;
  long lVar4;
  char *__function;
  stbrp_coord *psVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ImVector<stbrp_rect> pack_rects;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa40,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  num_rects = (atlas->CustomRects).Size;
  uVar9 = (ulong)num_rects;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa43,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  uVar8 = 8;
  if (8 < num_rects) {
    uVar8 = (ulong)num_rects;
  }
  rects = (stbrp_rect *)ImGui::MemAlloc(uVar8 * 0x18);
  memset(rects,0,uVar9 * 0x18);
  uVar8 = (ulong)(atlas->CustomRects).Size;
  if (0 < (long)uVar8) {
    puVar3 = &((atlas->CustomRects).Data)->Height;
    psVar5 = &rects->h;
    uVar6 = 0;
    do {
      if (uVar9 <= uVar6) goto LAB_0016dae5;
      psVar5[-1] = (uint)((ImFontAtlasCustomRect *)(puVar3 + -1))->Width;
      if ((long)(atlas->CustomRects).Size <= (long)uVar6) goto LAB_0016dace;
      *psVar5 = (uint)*puVar3;
      uVar6 = uVar6 + 1;
      puVar3 = puVar3 + 0x10;
      psVar5 = psVar5 + 6;
    } while (uVar8 != uVar6);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,rects,num_rects);
  piVar2 = &rects->was_packed;
  lVar4 = 6;
  uVar8 = 0;
  do {
    if (*piVar2 != 0) {
      if ((long)(atlas->CustomRects).Size <= (long)uVar8) goto LAB_0016dace;
      pIVar1 = (atlas->CustomRects).Data;
      *(short *)((long)pIVar1 + lVar4 + -2) = (short)piVar2[-2];
      if (uVar9 <= uVar8) break;
      if ((long)(atlas->CustomRects).Size <= (long)uVar8) goto LAB_0016dace;
      iVar7 = piVar2[-1];
      *(short *)((long)&pIVar1->Width + lVar4) = (short)iVar7;
      if ((long)(atlas->CustomRects).Size <= (long)uVar8) goto LAB_0016dace;
      if ((piVar2[-4] != (uint)*(ushort *)((long)pIVar1 + lVar4 + -6)) ||
         (piVar2[-3] != (uint)*(ushort *)((long)pIVar1 + lVar4 + -4))) {
        __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                      ,0xa53,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
      }
      iVar7 = piVar2[-3] + iVar7;
      if (iVar7 < atlas->TexHeight) {
        iVar7 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar7;
    }
    uVar8 = uVar8 + 1;
    piVar2 = piVar2 + 6;
    lVar4 = lVar4 + 0x20;
    if (uVar9 == uVar8) {
      ImGui::MemFree(rects);
      return;
    }
  } while( true );
LAB_0016dae5:
  __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
  goto LAB_0016dafa;
LAB_0016dace:
  __function = "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]";
LAB_0016dafa:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                ,0x703,__function);
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}